

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O1

void duckdb::alp::AlpDecompression<double>::Decompress
               (uint8_t *for_encoded,double *output,idx_t count,uint8_t vector_factor,
               uint8_t vector_exponent,uint16_t exceptions_count,double *exceptions,
               uint16_t *exceptions_positions,uint64_t frame_of_reference,uint8_t bit_width)

{
  double dVar1;
  long lVar2;
  idx_t i;
  idx_t iVar3;
  ulong uVar4;
  ulong uVar5;
  uint64_t *out;
  uint64_t local_2038 [1025];
  
  out = local_2038;
  switchD_005700f1::default(out,0,0x2000);
  if (count != 0 && bit_width != '\0') {
    uVar5 = 0;
    uVar4 = 0;
    do {
      duckdb_fastpforlib::fastunpack((uint32_t *)(for_encoded + (uVar5 >> 3)),out,(uint)bit_width);
      uVar4 = uVar4 + 0x20;
      uVar5 = uVar5 + (ulong)bit_width * 0x20;
      out = out + 0x20;
    } while (uVar4 < count);
  }
  if (count != 0) {
    iVar3 = 0;
    do {
      local_2038[iVar3] = local_2038[iVar3] + frame_of_reference;
      iVar3 = iVar3 + 1;
    } while (count != iVar3);
    lVar2 = *(long *)(AlpConstants::FACT_ARR + (ulong)vector_factor * 8);
    dVar1 = *(double *)(AlpTypedConstants<double>::FRAC_ARR + (ulong)vector_exponent * 8);
    iVar3 = 0;
    do {
      output[iVar3] = (double)(long)local_2038[iVar3] * (double)lVar2 * dVar1;
      iVar3 = iVar3 + 1;
    } while (count != iVar3);
  }
  if (exceptions_count != 0) {
    uVar4 = 0;
    do {
      output[exceptions_positions[uVar4]] = exceptions[uVar4];
      uVar4 = uVar4 + 1;
    } while (exceptions_count != uVar4);
  }
  return;
}

Assistant:

static void Decompress(uint8_t *for_encoded, T *output, idx_t count, uint8_t vector_factor, uint8_t vector_exponent,
	                       uint16_t exceptions_count, T *exceptions, const uint16_t *exceptions_positions,
	                       uint64_t frame_of_reference, uint8_t bit_width) {
		AlpEncodingIndices encoding_indices = {vector_exponent, vector_factor};

		// Bit Unpacking
		uint8_t for_decoded[AlpConstants::ALP_VECTOR_SIZE * 8] = {0};
		if (bit_width > 0) {
			BitpackingPrimitives::UnPackBuffer<uint64_t>(for_decoded, for_encoded, count, bit_width);
		}
		auto *encoded_integers = reinterpret_cast<uint64_t *>(data_ptr_cast(for_decoded));

		// unFOR
		for (idx_t i = 0; i < count; i++) {
			encoded_integers[i] += frame_of_reference;
		}

		// Decoding
		for (idx_t i = 0; i < count; i++) {
			auto encoded_integer = static_cast<int64_t>(encoded_integers[i]);
			output[i] = alp::AlpCompression<T, true>::DecodeValue(encoded_integer, encoding_indices);
		}

		// Exceptions Patching
		for (idx_t i = 0; i < exceptions_count; i++) {
			output[exceptions_positions[i]] = static_cast<T>(exceptions[i]);
		}
	}